

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutationMatrix.h
# Opt level: O3

void __thiscall
Eigen::internal::
permut_matrix_product_retval<Eigen::PermutationMatrix<-1,-1,int>,Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>,1,true>
::evalTo<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>>
          (permut_matrix_product_retval<Eigen::PermutationMatrix<_1,_1,int>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>,1,true>
           *this,Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true> *dst)

{
  double dVar1;
  int iVar2;
  PointerType pdVar3;
  PointerType pdVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  ulong uVar9;
  void *__s;
  undefined8 *puVar10;
  char *__function;
  long lVar11;
  long lVar12;
  ulong uVar13;
  Index size;
  ulong uVar14;
  
  pdVar3 = *(PointerType *)(this + 8);
  pdVar4 = (dst->super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>)
           .super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.
           m_data;
  if (pdVar4 == pdVar3) {
    plVar7 = *(long **)this;
    uVar14 = plVar7[1];
    if ((uVar14 & 0xffffffff) == 0) {
      __s = (void *)0x0;
    }
    else {
      uVar14 = (ulong)(int)uVar14;
      __s = malloc(uVar14);
      if (__s == (void *)0x0) {
        puVar10 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar10 = std::streambuf::xsgetn;
        __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      if ((long)uVar14 < 0) {
        __assert_fail("dim >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Matrix.h"
                      ,0xe1,
                      "Eigen::Matrix<bool, -1, 1, 0, -1>::Matrix(Index) [_Scalar = bool, _Rows = -1, _Cols = 1, _Options = 0, _MaxRows = -1, _MaxCols = 1]"
                     );
      }
      uVar13 = 0;
      memset(__s,0,uVar14);
      do {
        if (uVar14 <= uVar13) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x17a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<bool, -1, 1, 0, -1>, 1>::operator[](Index) [Derived = Eigen::Matrix<bool, -1, 1, 0, -1>, Level = 1]"
                       );
        }
        if (*(char *)((long)__s + uVar13) != '\x01') {
          *(undefined1 *)((long)__s + uVar13) = 1;
          lVar5 = *plVar7;
          iVar2 = *(int *)(lVar5 + uVar13 * 4);
          uVar9 = uVar13;
          while (uVar8 = (ulong)iVar2, uVar13 != uVar8) {
            if (((iVar2 < 0) ||
                (lVar6 = (dst->
                         super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>
                         ).
                         super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>
                         .m_rows.m_value, lVar6 <= (long)uVar8)) || (lVar6 <= (long)uVar9))
            goto LAB_0015a1c2;
            dVar1 = pdVar4[uVar8];
            pdVar4[uVar8] = pdVar4[uVar9];
            pdVar4[uVar9] = dVar1;
            *(undefined1 *)((long)__s + uVar8) = 1;
            uVar9 = uVar8;
            iVar2 = *(int *)(lVar5 + uVar8 * 4);
          }
        }
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)uVar14);
    }
    free(__s);
    return;
  }
  lVar5 = *(long *)(this + 0x10);
  if (0 < lVar5) {
    lVar6 = **(long **)this;
    lVar11 = 0;
    do {
      lVar12 = (long)*(int *)(lVar6 + lVar11 * 4);
      if ((lVar12 < 0) || (*(long *)(this + 0x10) <= lVar12)) {
        __function = 
        "Eigen::Block<const Eigen::Block<Eigen::Matrix<double, -1, 3>, -1, 1, true>, 1, 1>::Block(XprType &, Index) [XprType = const Eigen::Block<Eigen::Matrix<double, -1, 3>, -1, 1, true>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_0015a1d7;
      }
      if ((dst->super_BlockImpl<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_0>.m_rows
          .m_value <= lVar11) goto LAB_0015a1c2;
      pdVar4[lVar11] = pdVar3[lVar12];
      lVar11 = lVar11 + 1;
    } while (lVar5 != lVar11);
  }
  return;
LAB_0015a1c2:
  __function = 
  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, 3>, -1, 1, true>, 1, 1>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, 3>, -1, 1, true>, BlockRows = 1, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0015a1d7:
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/Core/Block.h"
                ,0x76,__function);
}

Assistant:

inline void evalTo(Dest& dst) const
    {
      const Index n = Side==OnTheLeft ? rows() : cols();
      // FIXME we need an is_same for expression that is not sensitive to constness. For instance
      // is_same_xpr<Block<const Matrix>, Block<Matrix> >::value should be true.
      if(    is_same<MatrixTypeNestedCleaned,Dest>::value
          && blas_traits<MatrixTypeNestedCleaned>::HasUsableDirectAccess
          && blas_traits<Dest>::HasUsableDirectAccess
          && extract_data(dst) == extract_data(m_matrix))
      {
        // apply the permutation inplace
        Matrix<bool,PermutationType::RowsAtCompileTime,1,0,PermutationType::MaxRowsAtCompileTime> mask(m_permutation.size());
        mask.fill(false);
        Index r = 0;
        while(r < m_permutation.size())
        {
          // search for the next seed
          while(r<m_permutation.size() && mask[r]) r++;
          if(r>=m_permutation.size())
            break;
          // we got one, let's follow it until we are back to the seed
          Index k0 = r++;
          Index kPrev = k0;
          mask.coeffRef(k0) = true;
          for(Index k=m_permutation.indices().coeff(k0); k!=k0; k=m_permutation.indices().coeff(k))
          {
                  Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>(dst, k)
            .swap(Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
                       (dst,((Side==OnTheLeft) ^ Transposed) ? k0 : kPrev));

            mask.coeffRef(k) = true;
            kPrev = k;
          }
        }
      }
      else
      {
        for(int i = 0; i < n; ++i)
        {
          Block<Dest, Side==OnTheLeft ? 1 : Dest::RowsAtCompileTime, Side==OnTheRight ? 1 : Dest::ColsAtCompileTime>
               (dst, ((Side==OnTheLeft) ^ Transposed) ? m_permutation.indices().coeff(i) : i)

          =

          Block<const MatrixTypeNestedCleaned,Side==OnTheLeft ? 1 : MatrixType::RowsAtCompileTime,Side==OnTheRight ? 1 : MatrixType::ColsAtCompileTime>
               (m_matrix, ((Side==OnTheRight) ^ Transposed) ? m_permutation.indices().coeff(i) : i);
        }
      }
    }